

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O3

int lib::io::Write(State *state)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  ValueT VVar3;
  int iVar4;
  UserData *user_data;
  String *pSVar5;
  size_t sVar6;
  anon_union_16_2_eed97686_for_String_2 *__ptr;
  int index;
  StackAPI api;
  StackAPI local_40;
  
  luna::StackAPI::StackAPI(&local_40,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_40,1,ValueT_UserData);
  iVar2 = 0;
  if (bVar1) {
    user_data = luna::StackAPI::GetUserData(&local_40,0);
    __stream = (FILE *)user_data->user_data_;
    iVar2 = luna::StackAPI::GetStackSize(&local_40);
    if (1 < iVar2) {
      index = 1;
      do {
        VVar3 = luna::StackAPI::GetValueType(&local_40,index);
        if (VVar3 == ValueT_Number) {
          luna::StackAPI::GetNumber(&local_40,index);
          iVar4 = fprintf(__stream,"%.14g");
          if (iVar4 < 0) goto LAB_00120d8e;
        }
        else {
          if (VVar3 != ValueT_String) {
            luna::StackAPI::ArgTypeError(&local_40,index,ValueT_String);
            return 0;
          }
          pSVar5 = luna::StackAPI::GetString(&local_40,index);
          if ((pSVar5->super_GCObject).field_0x11 == '\0') {
            __ptr = &pSVar5->field_1;
          }
          else {
            __ptr = (anon_union_16_2_eed97686_for_String_2 *)(pSVar5->field_1).str_;
          }
          sVar6 = fwrite(__ptr,(ulong)pSVar5->length_,1,__stream);
          if (sVar6 != 1) {
LAB_00120d8e:
            PushError(&local_40);
            return 2;
          }
        }
        index = index + 1;
      } while (iVar2 != index);
    }
    luna::StackAPI::PushUserData(&local_40,user_data);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Write(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_UserData))
            return 0;

        auto user_data = api.GetUserData(0);
        auto file = reinterpret_cast<std::FILE *>(user_data->GetData());
        auto params = api.GetStackSize();
        for (int i = 1; i < params; ++i)
        {
            auto type = api.GetValueType(i);
            if (type == luna::ValueT_String)
            {
                auto str = api.GetString(i);
                auto c_str = str->GetCStr();
                auto len = str->GetLength();
                if (std::fwrite(c_str, len, 1, file) != 1)
                    return PushError(api);
            }
            else if (type == luna::ValueT_Number)
            {
                if (std::fprintf(file, "%.14g", api.GetNumber(i)) < 0)
                    return PushError(api);
            }
            else
            {
                api.ArgTypeError(i, luna::ValueT_String);
                return 0;
            }
        }

        api.PushUserData(user_data);
        return 1;
    }